

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_CPY_m_i(DisasContext_conflict1 *s,arg_rpri_esz *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i64 pTVar2;
  _Bool _Var3;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((a->esz == 0) && ((s->insn & 0x2000) != 0)) {
    _Var3 = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    _Var3 = true;
    if (_Var1) {
      pTVar2 = tcg_const_i64_aarch64(tcg_ctx,(long)a->imm);
      do_cpy_m((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(int)s->uc->tcg_ctx,a->esz,a->rd,
               a->rn,(TCGv_i64)(ulong)(uint)a->pg);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
  }
  return _Var3;
}

Assistant:

static bool trans_CPY_m_i(DisasContext *s, arg_rpri_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, a->imm);
        do_cpy_m(s, a->esz, a->rd, a->rn, a->pg, t_imm);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}